

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# State.cpp
# Opt level: O0

bool __thiscall State::isFinished(State *this)

{
  int iVar1;
  int actual;
  int expected;
  int j;
  int i;
  State *this_local;
  
  expected = 0;
  do {
    if (this->height <= expected) {
      return true;
    }
    for (actual = 0; actual < this->width; actual = actual + 1) {
      iVar1 = expected * this->width + 1 + actual;
      if (iVar1 == this->size) {
        if (this->tiles[expected][actual] != 0) {
          return false;
        }
      }
      else if (this->tiles[expected][actual] != iVar1) {
        return false;
      }
    }
    expected = expected + 1;
  } while( true );
}

Assistant:

bool State::isFinished() {
    for (int i = 0; i < height; i++) {
        for (int j = 0; j < width; j++) {
            int expected = 1 + i * width + j;
            int actual = tiles[i][j];

            if (expected == size) {
                if (actual != 0) {
                    return false;
                }
            } else {
                if (actual != expected) {
                    return false;
                }
            }
        }
    }
    return true;
}